

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

AstNode * parse_suffixed_expression(ParserState *parser)

{
  int line_00;
  int iVar1;
  LexerState *ls_00;
  Scope *pSVar2;
  AstNode *pAVar3;
  AstNode *pAVar4;
  StringObject *methodname_00;
  AstNode *suffix_3;
  AstNode *suffix_2;
  StringObject *methodname;
  AstNode *suffix_1;
  AstNode *suffix;
  AstNode *suffixed_expr;
  int line;
  LexerState *ls;
  ParserState *parser_local;
  
  ls_00 = parser->ls;
  line_00 = ls_00->linenumber;
  if ((ls_00->t).token == 0x111) {
    pAVar3 = parse_builtin_expression(parser,0x111);
    return pAVar3;
  }
  pAVar3 = allocate_expr_ast_node(parser,EXPR_SUFFIXED);
  pAVar4 = parse_primary_expression(parser);
  (pAVar3->field_2).function_stmt.function_expr = pAVar4;
  pSVar2 = (pAVar3->field_2).for_stmt.for_body;
  (pAVar3->field_2).return_stmt.expr_list = (AstNodeList *)pSVar2->parent;
  (pAVar3->field_2).goto_stmt.name = (StringObject *)pSVar2->symbol_list;
  (pAVar3->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
LAB_00117433:
  do {
    while (iVar1 = (ls_00->t).token, iVar1 == 0x28) {
LAB_00117556:
      pAVar4 = parse_function_call(parser,(StringObject *)0x0,line_00);
      add_ast_node(parser->compiler_state,&(pAVar3->field_2).for_stmt.for_statement_list,pAVar4);
    }
    if (iVar1 == 0x2e) {
      pAVar4 = parse_field_selector(parser);
      add_ast_node(parser->compiler_state,&(pAVar3->field_2).for_stmt.for_statement_list,pAVar4);
      set_type((VariableType *)&(pAVar3->field_2).return_stmt,RAVI_TANY);
      goto LAB_00117433;
    }
    if (iVar1 == 0x3a) {
      raviX_next(ls_00);
      methodname_00 = check_name_and_next(ls_00);
      pAVar4 = parse_function_call(parser,methodname_00,line_00);
      add_ast_node(parser->compiler_state,&(pAVar3->field_2).for_stmt.for_statement_list,pAVar4);
    }
    else {
      if (iVar1 != 0x5b) {
        if ((iVar1 != 0x7b) && (iVar1 != 0x130)) {
          return pAVar3;
        }
        goto LAB_00117556;
      }
      pAVar4 = parse_yindex(parser);
      add_ast_node(parser->compiler_state,&(pAVar3->field_2).for_stmt.for_statement_list,pAVar4);
      set_type((VariableType *)&(pAVar3->field_2).return_stmt,RAVI_TANY);
    }
  } while( true );
}

Assistant:

static AstNode *parse_suffixed_expression(ParserState *parser)
{
	LexerState *ls = parser->ls;
	/* suffixedexp ->
	primaryexp { '.' NAME | '[' exp ']' | ':' NAME funcargs | funcargs } */
	int line = ls->linenumber;
	if (ls->t.token == TOK_C__new) {
		return parse_builtin_expression(parser, TOK_C__new);
	}
	AstNode *suffixed_expr = allocate_expr_ast_node(parser, EXPR_SUFFIXED);
	suffixed_expr->suffixed_expr.primary_expr = parse_primary_expression(parser);
	suffixed_expr->suffixed_expr.type = suffixed_expr->suffixed_expr.primary_expr->common_expr.type;
	suffixed_expr->suffixed_expr.suffix_list = NULL;
	for (;;) {
		switch (ls->t.token) {
		case '.': { /* fieldsel */
			AstNode *suffix = parse_field_selector(parser);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			set_type(&suffixed_expr->suffixed_expr.type, RAVI_TANY);
			break;
		}
		case '[': { /* '[' exp1 ']' */
			AstNode *suffix = parse_yindex(parser);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			set_type(&suffixed_expr->suffixed_expr.type, RAVI_TANY);
			break;
		}
		case ':': { /* ':' NAME funcargs */
			raviX_next(ls);
			const StringObject *methodname = check_name_and_next(ls);
			AstNode *suffix = parse_function_call(parser, methodname, line);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			break;
		}
		case '(':
		case TOK_STRING:
		case '{': { /* funcargs */
			AstNode *suffix = parse_function_call(parser, NULL, line);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			break;
		}
		default:
			return suffixed_expr;
		}
	}
}